

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O1

uv_os_sock_t create_tcp_socket(void)

{
  uint uVar1;
  int iVar2;
  uv_os_sock_t uVar3;
  uv_os_sock_t extraout_EAX;
  uv_os_sock_t extraout_EAX_00;
  uv_os_sock_t extraout_EAX_01;
  uint uVar4;
  undefined8 uVar5;
  uv_timer_t *puVar6;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  ulong unaff_RBX;
  uv_stream_t *puVar7;
  ulong uVar8;
  code *__addr;
  uv_connect_t *puVar9;
  uv_shutdown_t *puVar10;
  uv_write_t *puVar11;
  uv_tcp_t *puVar12;
  uv_stream_t *puVar13;
  int yes;
  undefined1 auStack_3d8 [16];
  code *pcStack_3c8;
  undefined1 auStack_3c0 [16];
  code *pcStack_3b0;
  code *pcStack_3a8;
  code *pcStack_3a0;
  code *pcStack_398;
  code *pcStack_390;
  undefined1 auStack_380 [16];
  sockaddr sStack_370;
  uv_write_t uStack_360;
  code *pcStack_268;
  sockaddr sStack_258;
  undefined1 auStack_248 [248];
  code *pcStack_150;
  undefined1 auStack_148 [248];
  uv_stream_t *puStack_50;
  undefined1 auStack_38 [16];
  ulong uStack_28;
  undefined4 local_c;
  
  puVar9 = (uv_connect_t *)0x2;
  uVar8 = 1;
  uVar1 = socket(2,1,0);
  if ((int)uVar1 < 0) {
    create_tcp_socket_cold_1();
  }
  else {
    unaff_RBX = (ulong)uVar1;
    local_c = 1;
    puVar9 = (uv_connect_t *)(ulong)uVar1;
    uVar8 = 1;
    iVar2 = setsockopt(uVar1,1,2,&local_c,4);
    if (iVar2 == 0) {
      return uVar1;
    }
  }
  create_tcp_socket_cold_2();
  puVar7 = (uv_stream_t *)(uVar8 & 0xffffffff);
  uStack_28 = unaff_RBX;
  auStack_38 = uv_buf_init("PING",4);
  puVar13 = connect_req.handle;
  if (puVar9 == &connect_req) {
    if ((int)uVar8 != 0) goto LAB_00173083;
    connect_cb_called = connect_cb_called + 1;
    iVar2 = uv_write(&write_req,connect_req.handle,auStack_38,1,write_cb);
    puVar7 = puVar13;
    if (iVar2 != 0) goto LAB_00173088;
    iVar2 = uv_shutdown(&shutdown_req,puVar13,shutdown_cb);
    if (iVar2 != 0) goto LAB_0017308d;
    iVar2 = uv_read_start(puVar13,alloc_cb,read_cb);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    connect_cb_cold_1();
LAB_00173083:
    connect_cb_cold_2();
LAB_00173088:
    connect_cb_cold_3();
LAB_0017308d:
    connect_cb_cold_4();
  }
  connect_cb_cold_5();
  pcStack_150 = (code *)0x1730a5;
  puStack_50 = puVar7;
  uVar3 = create_tcp_socket();
  pcStack_150 = (code *)0x1730ac;
  uVar1 = create_tcp_socket();
  uVar8 = (ulong)uVar1;
  pcStack_150 = (code *)0x1730b3;
  uVar5 = uv_default_loop();
  pcStack_150 = (code *)0x1730be;
  iVar2 = uv_tcp_init(uVar5,auStack_148);
  if (iVar2 == 0) {
    pcStack_150 = (code *)0x1730d0;
    iVar2 = uv_tcp_open(auStack_148,uVar3);
    if (iVar2 != 0) goto LAB_0017314c;
    pcStack_150 = (code *)0x1730de;
    iVar2 = uv_tcp_open(auStack_148,uVar1);
    if (iVar2 != -0x10) goto LAB_00173151;
    pcStack_150 = (code *)0x1730ea;
    iVar2 = close(uVar1);
    if (iVar2 != 0) goto LAB_00173156;
    pcStack_150 = (code *)0x1730f8;
    uv_close(auStack_148,0);
    pcStack_150 = (code *)0x1730fd;
    uVar5 = uv_default_loop();
    pcStack_150 = (code *)0x173107;
    uv_run(uVar5,0);
    pcStack_150 = (code *)0x17310c;
    uVar8 = uv_default_loop();
    pcStack_150 = (code *)0x173120;
    uv_walk(uVar8,close_walk_cb,0);
    pcStack_150 = (code *)0x17312a;
    uv_run(uVar8,0);
    pcStack_150 = (code *)0x17312f;
    uVar5 = uv_default_loop();
    pcStack_150 = (code *)0x173137;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_150 = (code *)0x17314c;
    run_test_tcp_open_twice_cold_1();
LAB_0017314c:
    pcStack_150 = (code *)0x173151;
    run_test_tcp_open_twice_cold_2();
LAB_00173151:
    pcStack_150 = (code *)0x173156;
    run_test_tcp_open_twice_cold_3();
LAB_00173156:
    pcStack_150 = (code *)0x17315b;
    run_test_tcp_open_twice_cold_4();
  }
  pcStack_150 = run_test_tcp_open_bound;
  run_test_tcp_open_twice_cold_5();
  pcStack_268 = (code *)0x17316d;
  pcStack_150 = (code *)uVar8;
  uVar1 = create_tcp_socket();
  uVar8 = (ulong)uVar1;
  pcStack_268 = (code *)0x173185;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_258);
  if (iVar2 == 0) {
    pcStack_268 = (code *)0x173192;
    uVar5 = uv_default_loop();
    pcStack_268 = (code *)0x17319f;
    iVar2 = uv_tcp_init(uVar5,auStack_248);
    if (iVar2 != 0) goto LAB_00173221;
    pcStack_268 = (code *)0x1731b4;
    iVar2 = bind(uVar1,&sStack_258,0x10);
    if (iVar2 != 0) goto LAB_00173226;
    pcStack_268 = (code *)0x1731c4;
    iVar2 = uv_tcp_open(auStack_248,uVar1);
    if (iVar2 != 0) goto LAB_0017322b;
    pcStack_268 = (code *)0x1731d9;
    iVar2 = uv_listen(auStack_248,0x80,0);
    if (iVar2 != 0) goto LAB_00173230;
    pcStack_268 = (code *)0x1731e2;
    uVar8 = uv_default_loop();
    pcStack_268 = (code *)0x1731f6;
    uv_walk(uVar8,close_walk_cb,0);
    pcStack_268 = (code *)0x173200;
    uv_run(uVar8,0);
    pcStack_268 = (code *)0x173205;
    uVar5 = uv_default_loop();
    pcStack_268 = (code *)0x17320d;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_268 = (code *)0x173221;
    run_test_tcp_open_bound_cold_1();
LAB_00173221:
    pcStack_268 = (code *)0x173226;
    run_test_tcp_open_bound_cold_2();
LAB_00173226:
    pcStack_268 = (code *)0x17322b;
    run_test_tcp_open_bound_cold_3();
LAB_0017322b:
    pcStack_268 = (code *)0x173230;
    run_test_tcp_open_bound_cold_4();
LAB_00173230:
    pcStack_268 = (code *)0x173235;
    run_test_tcp_open_bound_cold_5();
  }
  pcStack_268 = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_390 = (code *)0x173253;
  pcStack_268 = (code *)uVar8;
  auStack_380 = uv_buf_init("PING",4);
  puVar10 = (uv_shutdown_t *)0x194b6a;
  __addr = (code *)0x23a3;
  pcStack_390 = (code *)0x173273;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_370);
  if (iVar2 == 0) {
    pcStack_390 = (code *)0x173280;
    uVar1 = create_tcp_socket();
    uVar8 = (ulong)uVar1;
    __addr = (code *)&sStack_370;
    puVar10 = (uv_shutdown_t *)(ulong)uVar1;
    pcStack_390 = (code *)0x173293;
    iVar2 = connect(uVar1,(sockaddr *)__addr,0x10);
    if (iVar2 != 0) goto LAB_001733a1;
    pcStack_390 = (code *)0x1732a0;
    puVar10 = (uv_shutdown_t *)uv_default_loop();
    __addr = (code *)(&sStack_370 + 1);
    pcStack_390 = (code *)0x1732ad;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_001733a6;
    puVar10 = (uv_shutdown_t *)(&sStack_370 + 1);
    __addr = (code *)(ulong)uVar1;
    pcStack_390 = (code *)0x1732c1;
    iVar2 = uv_tcp_open();
    if (iVar2 != 0) goto LAB_001733ab;
    puVar11 = &write_req;
    __addr = (code *)(&sStack_370 + 1);
    pcStack_390 = (code *)0x1732eb;
    iVar2 = uv_write(&write_req,__addr,auStack_380,1,write_cb);
    puVar10 = (uv_shutdown_t *)puVar11;
    if (iVar2 != 0) goto LAB_001733b0;
    puVar10 = &shutdown_req;
    __addr = (code *)(&sStack_370 + 1);
    pcStack_390 = (code *)0x17330b;
    iVar2 = uv_shutdown(&shutdown_req,__addr,shutdown_cb);
    if (iVar2 != 0) goto LAB_001733b5;
    __addr = alloc_cb;
    puVar10 = (uv_shutdown_t *)(&sStack_370 + 1);
    pcStack_390 = (code *)0x17332b;
    iVar2 = uv_read_start(puVar10,alloc_cb,read_cb);
    if (iVar2 != 0) goto LAB_001733ba;
    pcStack_390 = (code *)0x173338;
    puVar10 = (uv_shutdown_t *)uv_default_loop();
    __addr = (code *)0x0;
    pcStack_390 = (code *)0x173342;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_001733bf;
    if (write_cb_called != 1) goto LAB_001733c4;
    if (close_cb_called != 1) goto LAB_001733c9;
    pcStack_390 = (code *)0x173362;
    uVar8 = uv_default_loop();
    pcStack_390 = (code *)0x173376;
    uv_walk(uVar8,close_walk_cb,0);
    __addr = (code *)0x0;
    pcStack_390 = (code *)0x173380;
    uv_run(uVar8);
    pcStack_390 = (code *)0x173385;
    puVar10 = (uv_shutdown_t *)uv_default_loop();
    pcStack_390 = (code *)0x17338d;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_390 = (code *)0x1733a1;
    run_test_tcp_open_connected_cold_1();
LAB_001733a1:
    pcStack_390 = (code *)0x1733a6;
    run_test_tcp_open_connected_cold_2();
LAB_001733a6:
    pcStack_390 = (code *)0x1733ab;
    run_test_tcp_open_connected_cold_3();
LAB_001733ab:
    pcStack_390 = (code *)0x1733b0;
    run_test_tcp_open_connected_cold_4();
LAB_001733b0:
    pcStack_390 = (code *)0x1733b5;
    run_test_tcp_open_connected_cold_5();
LAB_001733b5:
    pcStack_390 = (code *)0x1733ba;
    run_test_tcp_open_connected_cold_6();
LAB_001733ba:
    pcStack_390 = (code *)0x1733bf;
    run_test_tcp_open_connected_cold_7();
LAB_001733bf:
    pcStack_390 = (code *)0x1733c4;
    run_test_tcp_open_connected_cold_8();
LAB_001733c4:
    pcStack_390 = (code *)0x1733c9;
    run_test_tcp_open_connected_cold_9();
LAB_001733c9:
    pcStack_390 = (code *)0x1733ce;
    run_test_tcp_open_connected_cold_10();
  }
  pcStack_390 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if ((uv_write_t *)puVar10 == (uv_write_t *)0x0) {
    pcStack_398 = (code *)0x1733ea;
    write_cb_cold_2();
  }
  else if ((int)__addr == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  puVar10 = (uv_shutdown_t *)((ulong)__addr & 0xffffffff);
  pcStack_398 = shutdown_cb;
  write_cb_cold_1();
  if (puVar10 == &shutdown_req) {
    if ((int)__addr == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_3a0 = (code *)0x17340f;
    shutdown_cb_cold_1();
  }
  pcStack_3a0 = alloc_cb;
  shutdown_cb_cold_2();
  if (__addr < (sockaddr *)0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x31ec70;
  }
  pcStack_3a8 = read_cb;
  alloc_cb_cold_1();
  if (puVar10 == (uv_shutdown_t *)0x0) {
    pcStack_3b0 = (code *)0x17346f;
    read_cb_cold_4();
LAB_0017346f:
    pcStack_3b0 = (code *)0x173474;
    read_cb_cold_2();
LAB_00173474:
    pcStack_3b0 = (code *)0x173479;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)__addr) {
      if ((sockaddr *)__addr != (sockaddr *)0x4) goto LAB_0017346f;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        return extraout_EAX_01;
      }
      goto LAB_00173474;
    }
    if ((sockaddr *)__addr == (sockaddr *)0xfffffffffffff001) {
      uVar3 = uv_close();
      return uVar3;
    }
  }
  pcStack_3b0 = run_test_tcp_write_ready;
  read_cb_cold_1();
  puVar9 = (uv_connect_t *)0x194b6a;
  uVar1 = 0x23a3;
  pcStack_3c8 = (code *)0x173497;
  pcStack_3b0 = (code *)uVar8;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_3c0);
  if (iVar2 == 0) {
    pcStack_3c8 = (code *)0x1734a4;
    uVar4 = create_tcp_socket();
    uVar8 = (ulong)uVar4;
    pcStack_3c8 = (code *)0x1734ab;
    puVar9 = (uv_connect_t *)uv_default_loop();
    uVar1 = 0x31e9f0;
    pcStack_3c8 = (code *)0x1734ba;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_0017357a;
    puVar12 = &client;
    pcStack_3c8 = (code *)0x1734d0;
    iVar2 = uv_tcp_open();
    puVar9 = (uv_connect_t *)puVar12;
    if (iVar2 != 0) goto LAB_0017357f;
    puVar9 = &connect_req;
    uVar4 = 0x31e9f0;
    pcStack_3c8 = (code *)0x1734f5;
    iVar2 = uv_tcp_connect(&connect_req,&client,auStack_3c0,connect1_cb);
    if (iVar2 != 0) goto LAB_00173584;
    pcStack_3c8 = (code *)0x173502;
    puVar9 = (uv_connect_t *)uv_default_loop();
    uVar4 = 0;
    pcStack_3c8 = (code *)0x17350c;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_00173589;
    if (shutdown_requested != 1) goto LAB_0017358e;
    if (connect_cb_called != 1) goto LAB_00173593;
    if (write_cb_called < 1) goto LAB_00173598;
    if (close_cb_called != 1) goto LAB_0017359d;
    pcStack_3c8 = (code *)0x17353e;
    uVar8 = uv_default_loop();
    pcStack_3c8 = (code *)0x173552;
    uv_walk(uVar8,close_walk_cb,0);
    uVar4 = 0;
    pcStack_3c8 = (code *)0x17355c;
    uv_run(uVar8);
    pcStack_3c8 = (code *)0x173561;
    puVar9 = (uv_connect_t *)uv_default_loop();
    pcStack_3c8 = (code *)0x173569;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_3c8 = (code *)0x17357a;
    run_test_tcp_write_ready_cold_1();
LAB_0017357a:
    uVar4 = uVar1;
    pcStack_3c8 = (code *)0x17357f;
    run_test_tcp_write_ready_cold_2();
LAB_0017357f:
    pcStack_3c8 = (code *)0x173584;
    run_test_tcp_write_ready_cold_3();
LAB_00173584:
    pcStack_3c8 = (code *)0x173589;
    run_test_tcp_write_ready_cold_4();
LAB_00173589:
    pcStack_3c8 = (code *)0x17358e;
    run_test_tcp_write_ready_cold_5();
LAB_0017358e:
    pcStack_3c8 = (code *)0x173593;
    run_test_tcp_write_ready_cold_6();
LAB_00173593:
    pcStack_3c8 = (code *)0x173598;
    run_test_tcp_write_ready_cold_7();
LAB_00173598:
    pcStack_3c8 = (code *)0x17359d;
    run_test_tcp_write_ready_cold_8();
LAB_0017359d:
    pcStack_3c8 = (code *)0x1735a2;
    run_test_tcp_write_ready_cold_9();
  }
  pcStack_3c8 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar13 = connect_req.handle;
  pcStack_3c8 = (code *)uVar8;
  if (puVar9 == &connect_req) {
    puVar6 = (uv_timer_t *)puVar9;
    if (uVar4 != 0) goto LAB_0017366d;
    connect_cb_called = connect_cb_called + 1;
    puVar6 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_timer_init(puVar6,&tm);
    if (iVar2 != 0) goto LAB_00173672;
    puVar6 = &tm;
    iVar2 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar2 != 0) goto LAB_00173677;
    auStack_3d8 = uv_buf_init("P",1);
    puVar11 = &write_req;
    iVar2 = uv_write(&write_req,puVar13,auStack_3d8,1,write1_cb);
    puVar6 = (uv_timer_t *)puVar11;
    if (iVar2 == 0) {
      iVar2 = uv_read_start(puVar13,alloc_cb,read1_cb);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00173681;
    }
  }
  else {
    connect1_cb_cold_1();
    puVar6 = (uv_timer_t *)puVar9;
LAB_0017366d:
    connect1_cb_cold_2();
LAB_00173672:
    connect1_cb_cold_3();
LAB_00173677:
    connect1_cb_cold_4();
  }
  puVar13 = (uv_stream_t *)puVar6;
  connect1_cb_cold_5();
LAB_00173681:
  connect1_cb_cold_6();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  uVar3 = uv_close(puVar13,0);
  return uVar3;
}

Assistant:

static uv_os_sock_t create_tcp_socket(void) {
  uv_os_sock_t sock;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    int r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT(r == 0);
  }
#endif

  return sock;
}